

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

_Bool do_cmd_tunnel_aux(loc grid)

{
  uint32_t *puVar1;
  bool bVar2;
  chunk_conflict *c;
  player *ppVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t slot;
  wchar_t wVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  object *poVar10;
  object *poVar11;
  feature *pfVar12;
  player_state *state;
  char *pcVar13;
  uint8_t local_182;
  char *local_180;
  wchar_t digging_chances [5];
  player_state local_state;
  
  _Var4 = square_hasgoldvein(cave,grid);
  _Var5 = square_isrubble(cave,grid);
  slot = slot_by_name(player,"weapon");
  poVar10 = slot_object(player,slot);
  ppVar3 = player;
  _Var6 = do_cmd_tunnel_test(player,grid);
  if (_Var6) {
    state = (player_state *)&ppVar3->state;
    local_180 = "with your hands";
    if (poVar10 != (object *)0x0) {
      local_180 = "with your weapon";
    }
    poVar11 = player_best_digger(player,false);
    local_182 = '\x01';
    if (poVar11 == poVar10) {
      bVar2 = false;
    }
    else if ((poVar10 == (object *)0x0) || (_Var6 = obj_can_takeoff(poVar10), _Var6)) {
      bVar2 = true;
      local_182 = '\x01';
      if (poVar11 != (object *)0x0) {
        local_182 = poVar11->number;
        poVar11->number = '\x01';
      }
      (player->body).slots[slot].obj = poVar11;
      ppVar3 = player;
      state = &local_state;
      memcpy(state,&player->state,0x120);
      calc_bonuses(ppVar3,(player_state_conflict *)state,false,true);
      local_180 = "with your swap digger";
    }
    else {
      bVar2 = false;
      local_180 = "with your weapon";
    }
    calc_digging_chances((player_state_conflict *)state,digging_chances);
    wVar7 = square_digging(cave,grid);
    if ((uint)(wVar7 + L'\xfffffffa') < 0xfffffffb) {
      pfVar12 = square_feat(cave,grid);
      pcVar13 = pfVar12->name;
      pfVar12 = square_feat(cave,grid);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = format("Terrain index %d",(ulong)(uint)pfVar12->fidx);
      }
      else {
        pcVar13 = pfVar12->name;
      }
      msg("%s has misconfigured digging chance; please report this bug.",pcVar13);
      wVar7 = L'\x04';
    }
    wVar7 = digging_chances[(uint)(wVar7 + L'\xffffffff')];
    wVar8 = Rand_div(0x640);
    if (bVar2) {
      if (poVar11 != (object *)0x0) {
        poVar11->number = local_182;
      }
      (player->body).slots[slot].obj = poVar10;
      calc_bonuses(player,(player_state_conflict *)&local_state,false,true);
    }
    if ((wVar7 <= wVar8) ||
       ((_Var6 = square_isdiggable(cave,grid), !_Var6 &&
        (_Var6 = square_iscloseddoor(cave,grid), !_Var6)))) {
      if (L'\0' < wVar7) {
        if (_Var5) {
          msg("You dig in the rubble %s.",local_180);
        }
        else {
          pcVar13 = square_apparent_name((chunk_conflict *)player->cave,grid);
          msg("You tunnel into the %s %s.",pcVar13,local_180);
        }
        return true;
      }
      if (_Var5) {
        msg("You dig in the rubble %s with little effect.",local_180);
        return false;
      }
      pcVar13 = square_apparent_name((chunk_conflict *)player->cave,grid);
      msg("You chip away futilely %s at the %s.",local_180,pcVar13);
      return false;
    }
    sound(0x16);
    square_forget(cave,grid);
    square_tunnel_wall(cave,grid);
    ppVar3 = player;
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 0x60;
    if (_Var5) {
      msg("You have removed the rubble %s.",local_180);
      uVar9 = Rand_div(100);
      if (((int)uVar9 < 10) && (player->depth != 0)) {
        place_object(cave,(loc_conflict)grid,(int)player->depth,false,false,'\b',L'\0');
        poVar10 = square_object(cave,grid);
        ppVar3 = player;
        if (poVar10 != (object *)0x0) {
          poVar10 = square_object(cave,grid);
          _Var4 = ignore_item_ok(ppVar3,poVar10);
          if ((!_Var4) && (_Var4 = square_isseen(cave,grid), _Var4)) {
            msg("You have found something!");
          }
        }
      }
    }
    else {
      if (_Var4) {
        place_gold(cave,(loc_conflict)grid,(int)ppVar3->depth,'\x01');
        pcVar13 = "You have found something digging %s!";
      }
      else {
        pcVar13 = "You have finished the tunnel %s.";
      }
      msg(pcVar13,local_180);
    }
    c = cave;
    if (cave->depth == 0) {
      _Var4 = is_daytime();
      expose_to_sun((chunk *)c,grid,_Var4);
    }
    square_memorize(cave,grid);
    square_light_spot((chunk *)cave,grid);
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 0x60;
  }
  return false;
}

Assistant:

static bool do_cmd_tunnel_aux(struct loc grid)
{
	bool more = false;
	int digging_chances[DIGGING_MAX], chance;
	bool okay = false;
	bool gold = square_hasgoldvein(cave, grid);
	bool rubble = square_isrubble(cave, grid);
	bool digger_swapped = false;
	int weapon_slot = slot_by_name(player, "weapon");
	struct object *current_weapon = slot_object(player, weapon_slot);
	struct object *best_digger = NULL;
	struct player_state local_state;
	struct player_state *used_state = &player->state;
	int oldn = 1, dig_idx;
	const char *with_clause = current_weapon == NULL ? "with your hands" : "with your weapon";

	/* Verify legality */
	if (!do_cmd_tunnel_test(player, grid)) return (false);

	/* Find what we're digging with and our chance of success */
	best_digger = player_best_digger(player, false);
	if (best_digger != current_weapon &&
			(!current_weapon || obj_can_takeoff(current_weapon))) {
		digger_swapped = true;
		with_clause = "with your swap digger";
		/* Use only one without the overhead of gear_obj_for_use(). */
		if (best_digger) {
			oldn = best_digger->number;
			best_digger->number = 1;
		}
		player->body.slots[weapon_slot].obj = best_digger;
		memcpy(&local_state, &player->state, sizeof(local_state));
		calc_bonuses(player, &local_state, false, true);
		used_state = &local_state;
	}
	calc_digging_chances(used_state, digging_chances);

	/* Do we succeed? */
	dig_idx = square_digging(cave, grid);
	if (dig_idx < 1 || dig_idx > DIGGING_MAX) {
		msg("%s has misconfigured digging chance; please report this bug.",
			(square_feat(cave, grid)->name) ?
			square_feat(cave, grid)->name :
			format("Terrain index %d", square_feat(cave, grid)->fidx));
		dig_idx = DIGGING_GRANITE + 1;
	}
	chance = digging_chances[dig_idx - 1];
	okay = (chance > randint0(1600));

	/* Swap back */
	if (digger_swapped) {
		if (best_digger) {
			best_digger->number = oldn;
		}
		player->body.slots[weapon_slot].obj = current_weapon;
		calc_bonuses(player, &local_state, false, true);
	}

	/* Success */
	if (okay && twall(grid)) {
		/* Rubble is a special case - could be handled more generally NRM */
		if (rubble) {
			/* Message */
			msg("You have removed the rubble %s.", with_clause);

			/* Place an object (except in town) */
			if ((randint0(100) < 10) && player->depth) {
				/* Create a simple object */
				place_object(cave, grid, player->depth, false, false,
							 ORIGIN_RUBBLE, 0);

				/* Observe the new object */
				if (square_object(cave, grid)
						&& !ignore_item_ok(player,
						square_object(cave, grid))
						&& square_isseen(cave, grid)) {
					msg("You have found something!");
				}
			} 
		} else if (gold) {
			/* Found treasure */
			place_gold(cave, grid, player->depth, ORIGIN_FLOOR);
			msg("You have found something digging %s!", with_clause);
		} else {
			msg("You have finished the tunnel %s.", with_clause);
		}
		/* On the surface, new terrain may be exposed to the sun. */
		if (cave->depth == 0) expose_to_sun(cave, grid, is_daytime());
		/* Update the visuals. */
		square_memorize(cave, grid);
		square_light_spot(cave, grid);
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	} else if (chance > 0) {
		/* Failure, continue digging */
		if (rubble)
			msg("You dig in the rubble %s.", with_clause);
		else
			msg("You tunnel into the %s %s.",
				square_apparent_name(player->cave, grid), with_clause);
		more = true;
	} else {
		/* Don't automatically repeat if there's no hope. */
		if (rubble) {
			msg("You dig in the rubble %s with little effect.", with_clause);
		} else {
			msg("You chip away futilely %s at the %s.", with_clause,
				square_apparent_name(player->cave, grid));
		}
	}

	/* Result */
	return (more);
}